

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::MergeFromImpl<true>
          (internal *this,BoundedZCIS input,MessageLite *msg,TcParseTableBase *tc_table,
          ParseFlags parse_flags)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ParseFlags parse_flags_00;
  ParseContext *ctx_00;
  ushort *local_b8;
  char *ptr;
  BoundedZCIS input_local;
  ParseContext ctx;
  
  ctx_00 = input._8_8_;
  input_local.limit = (int)input.zcis;
  input_local.zcis = (ZeroCopyInputStream *)this;
  ParseContext::ParseContext<google::protobuf::io::ZeroCopyInputStream*&,int&>
            (&ctx,io::CodedInputStream::default_recursion_limit_,true,&ptr,&input_local.zcis,
             &input_local.limit);
  local_b8 = (ushort *)ptr;
  while (bVar1 = ParseContext::Done(&ctx,(char **)&local_b8), !bVar1) {
    uVar2 = (uint)(byte)(msg->_internal_metadata_).ptr_ & (uint)*local_b8;
    if ((uVar2 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar3 = (ulong)(uVar2 & 0xfffffff8);
    local_b8 = (ushort *)
               (**(code **)((long)&msg[3]._internal_metadata_.ptr_ + uVar3 * 2))
                         (ctx_00,local_b8,&ctx,
                          (ulong)*local_b8 ^ *(ulong *)((long)&msg[4]._vptr_MessageLite + uVar3 * 2)
                          ,msg,0);
    if ((local_b8 == (ushort *)0x0) || (ctx.super_EpsCopyInputStream.last_tag_minus_1_ != 0)) break;
  }
  if (((msg->_internal_metadata_).ptr_ & 0x100) == 0) {
    ptr = (char *)local_b8;
    if (local_b8 != (ushort *)0x0) goto LAB_0029f117;
    TcParser::VerifyHasBitConsistency((MessageLite *)ctx_00,(TcParseTableBase *)msg);
    ptr = (char *)local_b8;
  }
  else {
    ptr = (char *)(*(code *)msg[2]._internal_metadata_.ptr_)(ctx_00,local_b8,&ctx);
  }
  if ((ushort *)ptr == (ushort *)0x0) {
    return false;
  }
LAB_0029f117:
  EpsCopyInputStream::BackUp(&ctx.super_EpsCopyInputStream,ptr);
  if (ctx.super_EpsCopyInputStream.last_tag_minus_1_ != 0) {
    return false;
  }
  bVar1 = anon_unknown_15::CheckFieldPresence
                    (ctx_00,(MessageLite *)((ulong)tc_table & 0xffffffff),parse_flags_00);
  return bVar1;
}

Assistant:

bool MergeFromImpl(BoundedZCIS input, MessageLite* msg,
                   const internal::TcParseTableBase* tc_table,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input.zcis, input.limit);
  ptr = internal::TcParser::ParseLoop(msg, ptr, &ctx, tc_table);
  if (ABSL_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (ABSL_PREDICT_TRUE(ctx.EndedAtLimit())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}